

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

void set_plane_n4(MACROBLOCKD *xd,int bw,int bh,int num_planes)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 0xa30 - uVar1 != 0; uVar1 = uVar1 + 0xa30) {
    bVar3 = (byte)((uint)(bh << 2) >> (*(byte *)((long)xd->plane[0].pre + (uVar1 - 0x28)) & 0x1f));
    bVar4 = (byte)((uint)(bw << 2) >> (*(byte *)((long)xd->plane[0].pre + (uVar1 - 0x2c)) & 0x1f));
    if (bVar4 < 5) {
      bVar4 = 4;
    }
    *(byte *)((long)(xd->plane[0].seg_iqmatrix + -1) + uVar1 + 0x90) = bVar4;
    if (bVar3 < 5) {
      bVar3 = 4;
    }
    *(byte *)((long)(xd->plane[0].seg_iqmatrix + -1) + uVar1 + 0x91) = bVar3;
  }
  return;
}

Assistant:

static inline void set_plane_n4(MACROBLOCKD *const xd, int bw, int bh,
                                const int num_planes) {
  int i;
  for (i = 0; i < num_planes; i++) {
    xd->plane[i].width = (bw * MI_SIZE) >> xd->plane[i].subsampling_x;
    xd->plane[i].height = (bh * MI_SIZE) >> xd->plane[i].subsampling_y;

    xd->plane[i].width = AOMMAX(xd->plane[i].width, 4);
    xd->plane[i].height = AOMMAX(xd->plane[i].height, 4);
  }
}